

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_helpers.hpp
# Opt level: O1

bool ear::doIntersect<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>>
               (_Rb_tree_const_iterator<int> first1,_Rb_tree_const_iterator<int> last1,
               _Rb_tree_const_iterator<int> first2,_Rb_tree_const_iterator<int> last2)

{
  bool bVar1;
  
  bVar1 = first2._M_node != last2._M_node && first1._M_node != last1._M_node;
  if (first2._M_node != last2._M_node && first1._M_node != last1._M_node) {
    do {
      if ((int)first1._M_node[1]._M_color < (int)first2._M_node[1]._M_color) {
        first1._M_node = (_Base_ptr)std::_Rb_tree_increment(first1._M_node);
      }
      else {
        if ((int)first1._M_node[1]._M_color <= (int)first2._M_node[1]._M_color) {
          return bVar1;
        }
        first2._M_node = (_Base_ptr)std::_Rb_tree_increment(first2._M_node);
      }
      bVar1 = first2._M_node != last2._M_node && first1._M_node != last1._M_node;
    } while (bVar1);
  }
  return bVar1;
}

Assistant:

bool doIntersect(InputIterator1 first1, InputIterator1 last1,
                   InputIterator2 first2, InputIterator2 last2) {
    while (first1 != last1 && first2 != last2) {
      if (*first1 < *first2)
        ++first1;
      else if (*first2 < *first1)
        ++first2;
      else {
        return true;
      }
    }
    return false;
  }